

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inter_location.cpp
# Opt level: O2

bool __thiscall Am_Inter_Location::operator>=(Am_Inter_Location *this,Am_Inter_Location *test)

{
  int iVar1;
  Am_Inter_Location_Data *pAVar2;
  Am_Inter_Location_Data *pAVar3;
  Am_Inter_Location *pAVar4;
  bool bVar5;
  int iVar6;
  int src_x;
  int src_y;
  int src_x_00;
  int local_68;
  int local_64;
  int local_60;
  int local_5c;
  Am_Inter_Location *local_58;
  ulong local_50;
  ulong local_48;
  Am_Inter_Location *local_40;
  ulong local_38;
  
  pAVar2 = this->data;
  if (pAVar2 == (Am_Inter_Location_Data *)0x0) {
    Am_Error("Am_Inter_Location not initialized");
  }
  pAVar3 = test->data;
  if (pAVar3 != (Am_Inter_Location_Data *)0x0) {
    if (pAVar2->as_line == true) {
      Am_Error("Can\'t test contain inside an Am_Inter_Location that is a Line");
    }
    iVar6 = (pAVar3->data).rect.left;
    iVar1 = (pAVar3->data).rect.top;
    src_x = (pAVar3->data).rect.width;
    if (pAVar3->as_line == true) {
      src_y = (pAVar3->data).rect.height;
      src_x_00 = src_x;
      if (iVar6 < src_x) {
        src_x_00 = iVar6;
      }
      if (src_x < iVar6) {
        src_x = iVar6;
      }
      iVar6 = src_y;
      if (iVar1 < src_y) {
        iVar6 = iVar1;
      }
      if (src_y < iVar1) {
        src_y = iVar1;
      }
    }
    else {
      src_x = src_x + iVar6 + 1;
      src_x_00 = iVar6;
      iVar6 = iVar1;
      src_y = (pAVar3->data).rect.height + iVar1 + 1;
    }
    iVar1 = (pAVar2->data).rect.left;
    local_48 = (ulong)(uint)(pAVar2->data).rect.top;
    local_38 = (ulong)(uint)(pAVar2->data).rect.width;
    local_50 = (ulong)(uint)(pAVar2->data).rect.height;
    local_68 = src_y;
    local_64 = iVar6;
    local_60 = src_x_00;
    local_5c = src_x;
    local_40 = this;
    bVar5 = Am_Object::operator!=(&pAVar2->ref_obj,&pAVar3->ref_obj);
    pAVar4 = local_40;
    if (bVar5) {
      local_58 = test;
      bVar5 = Am_Translate_Coordinates
                        (&test->data->ref_obj,src_x_00,iVar6,&local_40->data->ref_obj,&local_60,
                         &local_64);
      if (!bVar5) {
        return false;
      }
      Am_Translate_Coordinates
                (&local_58->data->ref_obj,src_x,src_y,&pAVar4->data->ref_obj,&local_5c,&local_68);
      src_x_00 = local_60;
      src_x = local_5c;
    }
    bVar5 = false;
    if (((iVar1 <= src_x_00) && (iVar6 = (int)local_38 + iVar1 + 1, src_x_00 <= iVar6)) &&
       (bVar5 = false, src_x <= iVar6)) {
      iVar6 = (int)local_50 + (int)local_48 + 1;
      bVar5 = (local_68 <= iVar6 && local_64 <= iVar6) && (int)local_48 <= local_64;
    }
    return bVar5;
  }
  Am_Error("Other Am_Inter_Location not initialized");
}

Assistant:

bool
Am_Inter_Location::operator>=(const Am_Inter_Location &test) const
{
  int test_left, test_top, test_right, test_bottom;
  int my_left, my_top, my_right, my_bottom;

  if (!data)
    Am_Error("Am_Inter_Location not initialized");
  if (!test.data)
    Am_Error("Other Am_Inter_Location not initialized");
  if (data->as_line)
    Am_Error("Can't test contain inside an Am_Inter_Location that is a Line");

  my_left = data->data.rect.left;
  my_top = data->data.rect.top;
  my_right = my_left + data->data.rect.width + 1;
  my_bottom = my_top + data->data.rect.height + 1;

  if (test.data->as_line) {
    test_left = test.data->data.line.x1;
    test_top = test.data->data.line.y1;
    test_right = test.data->data.line.x2;
    test_bottom = test.data->data.line.y2;
    isort(test_left, test_right, test_left, test_right);
    isort(test_top, test_bottom, test_top, test_bottom);
  } else {
    test_left = test.data->data.rect.left;
    test_top = test.data->data.rect.top;
    test_right = test_left + test.data->data.rect.width + 1;
    test_bottom = test_top + test.data->data.rect.height + 1;
  }

  if (data->ref_obj != test.data->ref_obj) {
    if (!Am_Translate_Coordinates(test.data->ref_obj, test_left, test_top,
                                  data->ref_obj, test_left, test_top))
      return false; //not in the same window
    Am_Translate_Coordinates(test.data->ref_obj, test_right, test_bottom,
                             data->ref_obj, test_right, test_bottom);
  }

  //now ready to do the comparisons
  if (test_left < my_left || test_left > my_right || test_right > my_right)
    return false;
  if (test_top < my_top || test_top > my_bottom || test_bottom > my_bottom)
    return false;
  return true;
}